

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2.cpp
# Opt level: O0

error<idx2::idx2_err_code> __thiscall
idx2::InitFromBuffer(idx2 *this,idx2_file *Idx2,params *P,buffer *Buf)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  error<idx2::idx2_err_code> eVar7;
  stref Dir;
  idx2_file *local_1b0;
  undefined2 local_1a8;
  bool bStack_1a6;
  anon_class_1_0_00000001 local_199 [21];
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined8 local_178;
  int local_170;
  undefined8 local_164;
  int local_15c;
  idx2_file *local_158;
  undefined2 local_150;
  bool bStack_14e;
  anon_class_8_1_32d6a57b local_148;
  error<idx2::idx2_err_code> local_140;
  undefined1 local_130 [8];
  error<idx2::idx2_err_code> Result_1;
  undefined2 local_118;
  bool bStack_116;
  anon_class_8_1_32d6a57b local_110;
  error<idx2::idx2_err_code> local_108;
  undefined1 local_f8 [8];
  error<idx2::idx2_err_code> Result;
  buffer *Buf_local;
  params *P_local;
  idx2_file *Idx2_local;
  undefined2 local_b0;
  undefined1 uStack_ae;
  undefined5 uStack_ad;
  undefined8 local_30;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 *local_18;
  idx2 *local_10;
  
  Result._8_8_ = (Idx2->DecodeSubbandSpacings).Arr[2].Size;
  Dir.field_0.Ptr = (str)((Idx2->DecodeSubbandSpacings).Arr[2].Capacity & 0xffffffff);
  Dir._8_8_ = Buf;
  SetDir(this,(idx2_file *)Result._8_8_,Dir);
  SetDownsamplingFactor((idx2_file *)this,(v3i *)&(Idx2->DecodeSubbandSpacings).Arr[1].Alloc);
  eVar7 = ReadMetaFileFromBuffer((idx2_file *)this,(buffer *)P);
  local_108.Msg = eVar7.Msg;
  local_f8 = (undefined1  [8])local_108.Msg;
  local_108._8_2_ = eVar7._8_2_;
  Result.Msg._0_1_ = local_108.Code;
  Result.Msg._1_1_ = local_108.StackIdx;
  local_108.StrGened = eVar7.StrGened;
  Result.Msg._2_1_ = local_108.StrGened;
  local_108 = eVar7;
  bVar6 = error::operator_cast_to_bool((error *)local_f8);
  if (bVar6) {
    eVar7 = Finalize((idx2_file *)this,(params *)Idx2);
    local_140.Msg = eVar7.Msg;
    local_130 = (undefined1  [8])local_140.Msg;
    local_140._8_2_ = eVar7._8_2_;
    Result_1.Msg._0_1_ = local_140.Code;
    Result_1.Msg._1_1_ = local_140.StackIdx;
    local_140.StrGened = eVar7.StrGened;
    Result_1.Msg._2_1_ = local_140.StrGened;
    local_140 = eVar7;
    bVar6 = error::operator_cast_to_bool((error *)local_130);
    if (bVar6) {
      lVar4 = (Idx2->DecodeSubbandSpacings).Arr[1].Capacity;
      local_1c = ((int)lVar4 << 0xb) >> 0xb;
      local_18 = &local_30;
      local_20 = (int)((lVar4 << 0x16) >> 0x2b);
      local_170 = (int)(lVar4 * 2 >> 0x2b);
      local_30._0_4_ = local_1c;
      local_30._4_4_ = local_20;
      local_178 = local_30;
      local_164 = local_30;
      uVar5 = local_164;
      local_184 = 0;
      local_180 = 0;
      local_17c = 0;
      local_164._0_4_ = (int)local_30;
      bVar6 = false;
      if ((int)local_164 == 0) {
        local_164._4_4_ = (int)((ulong)local_30 >> 0x20);
        bVar6 = false;
        if (local_164._4_4_ == 0) {
          bVar6 = local_170 == 0;
        }
      }
      if (bVar6) {
        local_10 = this + 0x80;
        uVar1 = *(uint *)local_10;
        uVar2 = *(uint *)(this + 0x84);
        uVar3 = *(uint *)(this + 0x88);
        (Idx2->DecodeSubbandSpacings).Arr[1].Size = 0;
        (Idx2->DecodeSubbandSpacings).Arr[1].Capacity =
             (long)(int)(uVar1 & 0x1fffff) + (long)(int)(uVar2 & 0x1fffff) * 0x200000 +
             ((long)(int)(uVar3 & 0x1fffff) << 0x2a);
      }
      local_164 = uVar5;
      local_15c = local_170;
      local_24 = local_170;
      eVar7 = InitFromBuffer::anon_class_1_0_00000001::operator()(local_199);
      local_1b0 = (idx2_file *)eVar7.Msg;
      Idx2_local = local_1b0;
      local_1a8 = eVar7._8_2_;
      local_b0 = local_1a8;
      bStack_1a6 = eVar7.StrGened;
      uStack_ae = bStack_1a6;
    }
    else {
      local_148.Result = (error<idx2::idx2_err_code> *)local_130;
      eVar7 = InitFromBuffer::anon_class_8_1_32d6a57b::operator()(&local_148);
      local_158 = (idx2_file *)eVar7.Msg;
      Idx2_local = local_158;
      local_150 = eVar7._8_2_;
      local_b0 = local_150;
      bStack_14e = eVar7.StrGened;
      uStack_ae = bStack_14e;
    }
  }
  else {
    local_110.Result = (error<idx2::idx2_err_code> *)local_f8;
    eVar7 = InitFromBuffer::anon_class_8_1_32d6a57b::operator()(&local_110);
    Result_1._8_8_ = eVar7.Msg;
    Idx2_local = (idx2_file *)Result_1._8_8_;
    local_118 = eVar7._8_2_;
    local_b0 = local_118;
    bStack_116 = eVar7.StrGened;
    uStack_ae = bStack_116;
  }
  eVar7.Code = (undefined1)local_b0;
  eVar7.StackIdx = local_b0._1_1_;
  eVar7.Msg = Idx2_local->Name;
  eVar7.StrGened = (bool)uStack_ae;
  eVar7._11_5_ = uStack_ad;
  return eVar7;
}

Assistant:

error<idx2_err_code>
InitFromBuffer(idx2_file* Idx2, params& P, buffer& Buf)
{
  SetDir(Idx2, P.InDir);
  SetDownsamplingFactor(Idx2, P.DownsamplingFactor3);
  idx2_PropagateIfError(ReadMetaFileFromBuffer(Idx2, Buf));
  idx2_PropagateIfError(Finalize(Idx2, &P));
  if (Dims(P.DecodeExtent) == v3i(0)) // TODO: this could conflate with the user wanting to decode a
                                      // single sample (very unlikely though)
    P.DecodeExtent = extent(Idx2->Dims3);
  return idx2_Error(idx2_err_code::NoError);
}